

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O3

_Bool mips_cpu_has_work(CPUState *cs)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  if ((cs->interrupt_request & 2) == 0) {
    uVar6 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10ec);
  }
  else {
    uVar1 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10a4);
    uVar2 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10b4);
    uVar7 = uVar1 & 0xff00;
    uVar6 = *(uint *)((long)cs[1].tb_jmp_cache + 0x10ec);
    bVar4 = (uVar7 & uVar2) != 0;
    if ((uVar6 & 0x40) != 0) {
      bVar4 = uVar7 < (uVar2 & 0xff00);
    }
    if ((bVar4) &&
       (((((uVar1 & 7) == 1 && ((*(byte *)((long)cs[1].tb_jmp_cache + 0x485c) & 4) == 0)) &&
         ((*(byte *)((long)cs[1].tb_jmp_cache + 0xb89) & 4) == 0)) ||
        ((*(byte *)((long)cs[1].tb_jmp_cache + 0x4881) & 0x20) != 0)))) {
      bVar5 = 1;
      goto LAB_00942186;
    }
  }
  bVar5 = 0;
LAB_00942186:
  bVar3 = (byte)(cs->interrupt_request >> 8);
  if ((uVar6 & 4) != 0) {
    bVar5 = (byte)(*(uint *)(cs[1].tb_jmp_cache + 0x171) >> 0xd) &
            (byte)*(undefined4 *)((long)cs[1].tb_jmp_cache + 0xf9c) &
            ((ulong)cs[1].tb_jmp_cache[0x172] & 1) == 0 & (bVar3 & 1 | bVar5) &
            (byte)(int)cs[1].tb_jmp_cache[0x912]->pc;
  }
  return (_Bool)(bVar3 & *(byte *)(cs[1].tb_jmp_cache + 0x21f) >> 7 | bVar5);
}

Assistant:

static bool mips_cpu_has_work(CPUState *cs)
{
    MIPSCPU *cpu = MIPS_CPU(cs);
    CPUMIPSState *env = &cpu->env;
    bool has_work = false;

    /*
     * Prior to MIPS Release 6 it is implementation dependent if non-enabled
     * interrupts wake-up the CPU, however most of the implementations only
     * check for interrupts that can be taken.
     */
    if ((cs->interrupt_request & CPU_INTERRUPT_HARD) &&
        cpu_mips_hw_interrupts_pending(env)) {
        if (cpu_mips_hw_interrupts_enabled(env) ||
            (env->insn_flags & ISA_MIPS32R6)) {
            has_work = true;
        }
    }

    /* MIPS-MT has the ability to halt the CPU.  */
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        /*
         * The QEMU model will issue an _WAKE request whenever the CPUs
         * should be woken up.
         */
        if (cs->interrupt_request & CPU_INTERRUPT_WAKE) {
            has_work = true;
        }

        if (!mips_vpe_active(env)) {
            has_work = false;
        }
    }

    /* MIPS Release 6 has the ability to halt the CPU.  */
    if (env->CP0_Config5 & (1 << CP0C5_VP)) {
        if (cs->interrupt_request & CPU_INTERRUPT_WAKE) {
            has_work = true;
        }
        if (!mips_vp_active(env, cs)) {
            has_work = false;
        }
    }

    return has_work;
}